

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balance.hpp
# Opt level: O0

void gather_work_info(Master *master,vector<unsigned_int,_std::allocator<unsigned_int>_> *local_work
                     ,vector<WorkInfo,_std::allocator<WorkInfo>_> *all_work_info)

{
  uint uVar1;
  communicator *pcVar2;
  reference pvVar3;
  vector<WorkInfo,_std::allocator<WorkInfo>_> *in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  Master *in_RDI;
  int unaff_retaddr;
  void *in_stack_00000008;
  communicator *in_stack_00000010;
  int i;
  WorkInfo my_work_info;
  int nprocs;
  uint nlids;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  Master *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffb8;
  vector<WorkInfo,_std::allocator<WorkInfo>_> *in_stack_ffffffffffffffc0;
  undefined4 local_38;
  undefined4 local_30;
  undefined4 local_2c;
  
  diy::Master::size((Master *)0x120ffd);
  pcVar2 = diy::Master::communicator(in_RDI);
  diy::mpi::communicator::size(pcVar2);
  pcVar2 = diy::Master::communicator(in_RDI);
  diy::mpi::communicator::rank(pcVar2);
  local_30 = -1;
  local_2c = 0;
  local_38 = 0;
  do {
    uVar1 = diy::Master::size((Master *)0x121067);
    if (uVar1 <= local_38) {
      Catch::clara::std::vector<WorkInfo,_std::allocator<WorkInfo>_>::resize
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      pcVar2 = diy::Master::communicator(in_RDI);
      diy::mpi::datatype::datatype
                ((datatype *)pcVar2,
                 (MPI_Datatype *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      Catch::clara::std::vector<WorkInfo,_std::allocator<WorkInfo>_>::operator[](in_RDX,0);
      diy::mpi::detail::gather
                (in_stack_00000010,in_stack_00000008,unaff_retaddr,(datatype *)in_RDI,in_RSI,
                 (int)((ulong)in_RDX >> 0x20));
      return;
    }
    Catch::clara::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (in_RSI,(long)(int)local_38);
    if (local_30 == -1) {
LAB_001210b3:
      local_30 = diy::Master::gid(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      pvVar3 = Catch::clara::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RSI,(long)(int)local_38);
      local_2c = *pvVar3;
    }
    else {
      pvVar3 = Catch::clara::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RSI,(long)(int)local_38);
      if (local_2c < *pvVar3) goto LAB_001210b3;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void gather_work_info(const diy::Master&        master,
                      std::vector<diy::Work>&   local_work,             // work for each local block
                      std::vector<WorkInfo>&    all_work_info)          // (output) global work info
{
    auto nlids  = master.size();                    // my local number of blocks
    auto nprocs = master.communicator().size();     // global number of procs

    WorkInfo my_work_info = { master.communicator().rank(), -1, 0, 0, (int)nlids };

    // compile my work info
    for (auto i = 0; i < master.size(); i++)
    {
        my_work_info.proc_work += local_work[i];
        if (my_work_info.top_gid == -1 || my_work_info.top_work < local_work[i])
        {
            my_work_info.top_gid    = master.gid(i);
            my_work_info.top_work   = local_work[i];
        }
    }

    // debug
//     fmt::print(stderr, "exchange_work_info(): proc_rank {} top_gid {} top_work {} proc_work {} nlids {}\n",
//             my_work_info.proc_rank, my_work_info.top_gid, my_work_info.top_work, my_work_info.proc_work, my_work_info.nlids);

    // gather work info
    all_work_info.resize(nprocs);
    diy::mpi::detail::gather(master.communicator(), &my_work_info.proc_rank,
            sizeof(WorkInfo) / sizeof(WorkInfo::proc_rank), MPI_INT, &all_work_info[0].proc_rank, 0);  // assumes all elements of WorkInfo are sizeof(int)
}